

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
cppqc::shrinkIntegral<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int x)

{
  int iVar1;
  int n;
  int local_24;
  int local_20 [2];
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = x;
  if (x < 0) {
    local_20[0] = -x;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,local_20);
  }
  for (; iVar1 != 0; iVar1 = iVar1 / 2) {
    local_24 = x - iVar1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_24);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}